

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O1

void __thiscall FIX::FileStore::refresh(FileStore *this)

{
  int __oflag;
  undefined8 local_28;
  int64_t iStack_20;
  
  DateTime::nowUtc();
  (this->m_cache).m_nextSenderMsgSeqNum = 1;
  (this->m_cache).m_nextTargetMsgSeqNum = 1;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_cache).m_messages._M_t);
  *(undefined8 *)&(this->m_cache).m_creationTime.super_DateTime.m_date = local_28;
  (this->m_cache).m_creationTime.super_DateTime.m_time = iStack_20;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
  ::clear(&(this->m_offsets)._M_t);
  open(this,(char *)0x0,__oflag);
  return;
}

Assistant:

EXCEPT(IOException) {
  try {
    m_cache.reset(UtcTimeStamp::now());
    m_offsets.clear();
    open(false);
  } catch (std::exception &e) {
    throw IOException(e.what());
  }
}